

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

void al_destroy_thread(ALLEGRO_THREAD *thread)

{
  ALLEGRO_THREAD *thread_00;
  long in_RDI;
  void *unaff_retaddr;
  void **in_stack_ffffffffffffffe8;
  
  if (in_RDI != 0) {
    thread_00 = (ALLEGRO_THREAD *)(ulong)*(uint *)(in_RDI + 0xa8);
    switch(thread_00) {
    case (ALLEGRO_THREAD *)0x0:
    case (ALLEGRO_THREAD *)0x1:
    case (ALLEGRO_THREAD *)0x2:
      al_join_thread(thread_00,in_stack_ffffffffffffffe8);
      break;
    case (ALLEGRO_THREAD *)0x3:
      break;
    case (ALLEGRO_THREAD *)0x4:
      break;
    case (ALLEGRO_THREAD *)0x5:
      break;
    case (ALLEGRO_THREAD *)0x6:
    }
    *(undefined4 *)(in_RDI + 0xa8) = 5;
    al_free_with_context
              (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(char *)thread_00,
               (char *)in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void al_destroy_thread(ALLEGRO_THREAD *thread)
{
   if (!thread) {
      return;
   }

   /* Join if required. */
   switch (thread->thread_state) {
      case THREAD_STATE_CREATED: /* fall through */
      case THREAD_STATE_STARTING: /* fall through */
      case THREAD_STATE_STARTED:
         al_join_thread(thread, NULL);
         break;
      case THREAD_STATE_JOINING:
         ASSERT(thread->thread_state != THREAD_STATE_JOINING);
         break;
      case THREAD_STATE_JOINED:
         break;
      case THREAD_STATE_DESTROYED:
         ASSERT(thread->thread_state != THREAD_STATE_DESTROYED);
         break;
      case THREAD_STATE_DETACHED:
         ASSERT(thread->thread_state != THREAD_STATE_DETACHED);
         break;
   }

   /* May help debugging. */
   thread->thread_state = THREAD_STATE_DESTROYED;
   al_free(thread);
}